

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O3

void xmlC14NErrFull(xmlC14NCtxPtr ctxt,xmlNodePtr node,int code,char *str1,char *msg,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_d8;
  undefined1 local_b8 [40];
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Da;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  if (ctxt != (xmlC14NCtxPtr)0x0) {
    ctxt->error = code;
  }
  local_d8.reg_save_area = local_b8;
  local_d8.overflow_arg_area = &stack0x00000008;
  local_d8.gp_offset = 0x28;
  local_d8.fp_offset = 0x30;
  local_90 = in_R9;
  iVar1 = xmlVRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,ctxt,node,
                         0x15,code,XML_ERR_ERROR,(char *)0x0,0,str1,(char *)0x0,(char *)0x0,0,0,msg,
                         &local_d8);
  if (iVar1 < 0) {
    if (ctxt != (xmlC14NCtxPtr)0x0) {
      ctxt->error = 2;
    }
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x15,
                        (xmlError *)0x0);
  }
  return;
}

Assistant:

static void
xmlC14NErrFull(xmlC14NCtxPtr ctxt, xmlNodePtr node, int code, const char *str1,
               const char *msg, ...)
{
    va_list ap;
    int res;

    if (ctxt != NULL)
        ctxt->error = code;

    va_start(ap, msg);
    res = xmlVRaiseError(NULL, NULL, NULL, ctxt, node,
                         XML_FROM_C14N, code, XML_ERR_ERROR, NULL, 0,
                         str1, NULL, NULL, 0, 0,
                         msg, ap);
    va_end(ap);
    if (res < 0)
        xmlC14NErrMemory(ctxt);
}